

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,inf_or_nan_writer *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  wchar_t __tmp;
  char *pcVar8;
  size_t size;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  basic_buffer<wchar_t> *c;
  int iVar20;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  uVar12 = (ulong)spec->width_;
  uVar14 = 4 - (ulong)(f->sign == '\0');
  puVar2 = *(undefined8 **)this;
  lVar11 = puVar2[2];
  uVar10 = uVar12 - uVar14;
  if (uVar12 < uVar14 || uVar10 == 0) {
    uVar14 = uVar14 + lVar11;
    if ((ulong)puVar2[3] < uVar14) {
      (**(code **)*puVar2)(puVar2,uVar14);
    }
    puVar2[2] = uVar14;
    piVar9 = (int *)(lVar11 * 4 + puVar2[1]);
    if (f->sign != '\0') {
      *piVar9 = (int)f->sign;
      piVar9 = piVar9 + 1;
    }
    pcVar8 = f->str;
    uVar10 = 4;
    lVar11 = 0;
    do {
      piVar9[lVar11] = (int)pcVar8[lVar11];
      uVar10 = uVar10 - 1;
      lVar11 = lVar11 + 1;
    } while (1 < uVar10);
  }
  else {
    uVar13 = lVar11 + uVar12;
    if ((ulong)puVar2[3] < uVar13) {
      (**(code **)*puVar2)(puVar2,uVar13);
    }
    puVar2[2] = uVar13;
    auVar6 = _DAT_00153130;
    auVar5 = _DAT_0014f5f0;
    auVar4 = _DAT_0014f5e0;
    lVar3 = puVar2[1];
    piVar9 = (int *)(lVar3 + lVar11 * 4);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar13 = uVar10 >> 1;
      if (1 < uVar10) {
        piVar9 = piVar9 + uVar13;
        uVar10 = uVar13 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar25._8_4_ = (int)uVar10;
        auVar25._0_8_ = uVar10;
        auVar25._12_4_ = (int)(uVar10 >> 0x20);
        lVar3 = lVar3 + lVar11 * 4;
        lVar11 = 0;
        auVar25 = auVar25 ^ _DAT_0014f5f0;
        do {
          auVar22._8_4_ = (int)lVar11;
          auVar22._0_8_ = lVar11;
          auVar22._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar26 = (auVar22 | auVar4) ^ auVar5;
          iVar20 = auVar25._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar20 && auVar25._0_4_ < auVar26._0_4_ ||
                      iVar20 < auVar26._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar11 * 4) = wVar1;
          }
          if ((auVar26._12_4_ != auVar25._12_4_ || auVar26._8_4_ <= auVar25._8_4_) &&
              auVar26._12_4_ <= auVar25._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar11 * 4) = wVar1;
          }
          auVar22 = (auVar22 | auVar6) ^ auVar5;
          iVar27 = auVar22._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar22._0_4_ <= auVar25._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar11 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar11 * 4) = wVar1;
          }
          lVar11 = lVar11 + 4;
        } while ((uVar10 - ((uint)(uVar13 + 0x3fffffffffffffff) & 3)) + 4 != lVar11);
      }
      if (f->sign != '\0') {
        *piVar9 = (int)f->sign;
        piVar9 = piVar9 + 1;
      }
      pcVar8 = f->str;
      uVar10 = 4;
      do {
        piVar7 = piVar9;
        *piVar7 = (int)*pcVar8;
        auVar6 = _DAT_00153130;
        auVar5 = _DAT_0014f5f0;
        auVar4 = _DAT_0014f5e0;
        pcVar8 = pcVar8 + 1;
        uVar10 = uVar10 - 1;
        piVar9 = piVar7 + 1;
      } while (1 < uVar10);
      if (uVar12 != uVar14) {
        uVar12 = (uVar12 * 4 + (uVar14 + uVar13) * -4) - 4;
        auVar26._8_4_ = (int)uVar12;
        auVar26._0_8_ = uVar12;
        auVar26._12_4_ = (int)(uVar12 >> 0x20);
        auVar17._0_8_ = uVar12 >> 2;
        auVar17._8_8_ = auVar26._8_8_ >> 2;
        uVar10 = 0;
        auVar17 = auVar17 ^ _DAT_0014f5f0;
        do {
          auVar23._8_4_ = (int)uVar10;
          auVar23._0_8_ = uVar10;
          auVar23._12_4_ = (int)(uVar10 >> 0x20);
          auVar25 = (auVar23 | auVar4) ^ auVar5;
          iVar20 = auVar17._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar20 && auVar17._0_4_ < auVar25._0_4_ ||
                      iVar20 < auVar25._4_4_) & 1)) {
            (piVar7 + 1)[uVar10] = wVar1;
          }
          if ((auVar25._12_4_ != auVar17._12_4_ || auVar25._8_4_ <= auVar17._8_4_) &&
              auVar25._12_4_ <= auVar17._12_4_) {
            piVar7[uVar10 + 2] = wVar1;
          }
          auVar25 = (auVar23 | auVar6) ^ auVar5;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar17._0_4_)) {
            piVar7[uVar10 + 3] = wVar1;
            piVar7[uVar10 + 4] = wVar1;
          }
          uVar10 = uVar10 + 4;
        } while (((uVar12 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar12 != uVar14) {
        piVar9 = piVar9 + uVar10;
        uVar12 = (uVar12 * 4 + uVar14 * -4) - 4;
        auVar15._8_4_ = (int)uVar12;
        auVar15._0_8_ = uVar12;
        auVar15._12_4_ = (int)(uVar12 >> 0x20);
        auVar16._0_8_ = uVar12 >> 2;
        auVar16._8_8_ = auVar15._8_8_ >> 2;
        lVar3 = lVar3 + lVar11 * 4;
        uVar10 = 0;
        auVar16 = auVar16 ^ _DAT_0014f5f0;
        do {
          auVar21._8_4_ = (int)uVar10;
          auVar21._0_8_ = uVar10;
          auVar21._12_4_ = (int)(uVar10 >> 0x20);
          auVar25 = (auVar21 | auVar4) ^ auVar5;
          iVar20 = auVar16._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar20 && auVar16._0_4_ < auVar25._0_4_ ||
                      iVar20 < auVar25._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + uVar10 * 4) = wVar1;
          }
          if ((auVar25._12_4_ != auVar16._12_4_ || auVar25._8_4_ <= auVar16._8_4_) &&
              auVar25._12_4_ <= auVar16._12_4_) {
            *(wchar_t *)(lVar3 + 4 + uVar10 * 4) = wVar1;
          }
          auVar25 = (auVar21 | auVar6) ^ auVar5;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar16._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + uVar10 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + uVar10 * 4) = wVar1;
          }
          uVar10 = uVar10 + 4;
        } while (((uVar12 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
      }
      if (f->sign != '\0') {
        *piVar9 = (int)f->sign;
        piVar9 = piVar9 + 1;
      }
      pcVar8 = f->str;
      uVar10 = 4;
      lVar11 = 0;
      do {
        piVar9[lVar11] = (int)pcVar8[lVar11];
        uVar10 = uVar10 - 1;
        lVar11 = lVar11 + 1;
      } while (1 < uVar10);
    }
    else {
      if (f->sign != '\0') {
        *piVar9 = (int)f->sign;
        piVar9 = piVar9 + 1;
      }
      pcVar8 = f->str;
      uVar10 = 4;
      do {
        piVar7 = piVar9;
        *piVar7 = (int)*pcVar8;
        auVar6 = _DAT_00153130;
        auVar5 = _DAT_0014f5f0;
        auVar4 = _DAT_0014f5e0;
        pcVar8 = pcVar8 + 1;
        uVar10 = uVar10 - 1;
        piVar9 = piVar7 + 1;
      } while (1 < uVar10);
      if (uVar12 != uVar14) {
        uVar12 = (uVar12 * 4 + uVar14 * -4) - 4;
        auVar18._8_4_ = (int)uVar12;
        auVar18._0_8_ = uVar12;
        auVar18._12_4_ = (int)(uVar12 >> 0x20);
        auVar19._0_8_ = uVar12 >> 2;
        auVar19._8_8_ = auVar18._8_8_ >> 2;
        uVar10 = 0;
        auVar19 = auVar19 ^ _DAT_0014f5f0;
        do {
          auVar24._8_4_ = (int)uVar10;
          auVar24._0_8_ = uVar10;
          auVar24._12_4_ = (int)(uVar10 >> 0x20);
          auVar25 = (auVar24 | auVar4) ^ auVar5;
          iVar20 = auVar19._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar20 && auVar19._0_4_ < auVar25._0_4_ ||
                      iVar20 < auVar25._4_4_) & 1)) {
            (piVar7 + 1)[uVar10] = wVar1;
          }
          if ((auVar25._12_4_ != auVar19._12_4_ || auVar25._8_4_ <= auVar19._8_4_) &&
              auVar25._12_4_ <= auVar19._12_4_) {
            piVar7[uVar10 + 2] = wVar1;
          }
          auVar25 = (auVar24 | auVar6) ^ auVar5;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar19._0_4_)) {
            piVar7[uVar10 + 3] = wVar1;
            piVar7[uVar10 + 4] = wVar1;
          }
          uVar10 = uVar10 + 4;
        } while (((uVar12 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
      }
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR wchar_t fill() const { return fill_; }